

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O0

bool __thiscall
slang::ast::RangeSelectExpression::isConstantSelect
          (RangeSelectExpression *this,EvalContext *context)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Expression *this_00;
  RangeSelectExpression *in_RDI;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  Expression *in_stack_ffffffffffffff58;
  undefined1 local_82;
  
  value(in_RDI);
  not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xf5d905);
  bVar3 = Type::hasFixedRange((Type *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50))
  ;
  bVar2 = false;
  bVar1 = false;
  local_82 = false;
  if (bVar3) {
    left(in_RDI);
    Expression::eval(in_stack_ffffffffffffff58,
                     (EvalContext *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
    bVar2 = true;
    bVar3 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xf5d95c);
    local_82 = false;
    if (bVar3) {
      this_00 = right(in_RDI);
      Expression::eval(this_00,(EvalContext *)
                               CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
      bVar1 = true;
      local_82 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xf5d9ac);
    }
  }
  if (bVar1) {
    slang::ConstantValue::~ConstantValue((ConstantValue *)0xf5d9dc);
  }
  if (bVar2) {
    slang::ConstantValue::~ConstantValue((ConstantValue *)0xf5d9ef);
  }
  return local_82;
}

Assistant:

bool RangeSelectExpression::isConstantSelect(EvalContext& context) const {
    return value().type->hasFixedRange() && left().eval(context) && right().eval(context);
}